

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

void __thiscall
soul::ResolutionPass::TypeResolver::resolveVariableDeclarationInitialValue
          (TypeResolver *this,VariableDeclaration *v,Type *type)

{
  Allocator *pAVar1;
  Type *pTVar2;
  bool bVar3;
  Expression *pEVar4;
  Expression *pEVar5;
  TypeCast *pTVar6;
  pool_ptr<soul::AST::Expression> local_78;
  pool_ptr<soul::AST::Expression> local_70;
  pool_ptr<soul::AST::Expression> local_68;
  pool_ptr<soul::AST::Expression> local_60;
  pool_ptr<soul::AST::Expression> local_58;
  Type local_50;
  pool_ptr<soul::AST::Expression> local_28;
  Type *local_20;
  Type *type_local;
  VariableDeclaration *v_local;
  TypeResolver *this_local;
  
  local_28.object = (v->initialValue).object;
  local_20 = type;
  type_local = (Type *)v;
  v_local = (VariableDeclaration *)this;
  bVar3 = AST::isResolvedAsValue(&local_28);
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_28);
  if (bVar3) {
    pEVar4 = pool_ptr<soul::AST::Expression>::operator->
                       ((pool_ptr<soul::AST::Expression> *)&type_local[2].boundingSize);
    (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[4])();
    bVar3 = Type::isIdentical(&local_50,local_20);
    Type::~Type(&local_50);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      pEVar4 = pool_ptr<soul::AST::Expression>::operator->
                         ((pool_ptr<soul::AST::Expression> *)&type_local[2].boundingSize);
      pTVar2 = local_20;
      pEVar5 = pool_ptr<soul::AST::Expression>::operator*
                         ((pool_ptr<soul::AST::Expression> *)&type_local[2].boundingSize);
      SanityCheckPass::expectSilentCastPossible
                (&(pEVar4->super_Statement).super_ASTObject.context,pTVar2,pEVar5);
      pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
      pEVar4 = pool_ptr<soul::AST::Expression>::operator->
                         ((pool_ptr<soul::AST::Expression> *)&type_local[2].boundingSize);
      pTVar2 = local_20;
      pEVar5 = pool_ptr<soul::AST::Expression>::operator*
                         ((pool_ptr<soul::AST::Expression> *)&type_local[2].boundingSize);
      pTVar6 = AST::Allocator::
               allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type_const&,soul::AST::Expression&>
                         (pAVar1,&(pEVar4->super_Statement).super_ASTObject.context,pTVar2,pEVar5);
      pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::TypeCast,void>(&local_58,pTVar6);
      *(Expression **)&type_local[2].boundingSize = local_58.object;
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_58);
    }
    pool_ptr<soul::AST::Expression>::pool_ptr(&local_60);
    *(Expression **)(type_local + 2) = local_60.object;
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_60);
    (this->super_ErrorIgnoringRewritingASTVisitor).super_RewritingASTVisitor.itemsReplaced =
         (this->super_ErrorIgnoringRewritingASTVisitor).super_RewritingASTVisitor.itemsReplaced + 1;
  }
  else {
    local_68.object = *(Expression **)&type_local[2].boundingSize;
    bVar3 = is_type<soul::AST::CommaSeparatedList,soul::AST::Expression>(&local_68);
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_68);
    if (bVar3) {
      pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
      pEVar4 = pool_ptr<soul::AST::Expression>::operator->
                         ((pool_ptr<soul::AST::Expression> *)&type_local[2].boundingSize);
      pTVar2 = local_20;
      pEVar5 = pool_ptr<soul::AST::Expression>::operator*
                         ((pool_ptr<soul::AST::Expression> *)&type_local[2].boundingSize);
      pTVar6 = AST::Allocator::
               allocate<soul::AST::TypeCast,soul::AST::Context&,soul::Type_const&,soul::AST::Expression&>
                         (pAVar1,&(pEVar4->super_Statement).super_ASTObject.context,pTVar2,pEVar5);
      pool_ptr<soul::AST::Expression>::pool_ptr<soul::AST::TypeCast,void>(&local_70,pTVar6);
      *(Expression **)&type_local[2].boundingSize = local_70.object;
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_70);
      pool_ptr<soul::AST::Expression>::pool_ptr(&local_78);
      *(Expression **)(type_local + 2) = local_78.object;
      pool_ptr<soul::AST::Expression>::~pool_ptr(&local_78);
      (this->super_ErrorIgnoringRewritingASTVisitor).super_RewritingASTVisitor.itemsReplaced =
           (this->super_ErrorIgnoringRewritingASTVisitor).super_RewritingASTVisitor.itemsReplaced +
           1;
    }
  }
  return;
}

Assistant:

void resolveVariableDeclarationInitialValue (AST::VariableDeclaration& v, const Type& type)
        {
            if (AST::isResolvedAsValue (v.initialValue))
            {
                if (! v.initialValue->getResultType().isIdentical (type))
                {
                    SanityCheckPass::expectSilentCastPossible (v.initialValue->context, type, *v.initialValue);
                    v.initialValue = allocator.allocate<AST::TypeCast> (v.initialValue->context, type, *v.initialValue);
                }

                v.declaredType = {};
                ++itemsReplaced;
            }
            else if (is_type<AST::CommaSeparatedList> (v.initialValue))
            {
                v.initialValue = allocator.allocate<AST::TypeCast> (v.initialValue->context, type, *v.initialValue);
                v.declaredType = {};
                ++itemsReplaced;
            }
        }